

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::construct_storage(torrent *this)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  file_storage *pfVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  storage_params params;
  sha1_hash local_b0;
  undefined8 local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  undefined8 local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  file_storage *local_70;
  element_type *local_68;
  string *local_60;
  uint local_58;
  vector<download_priority_t,_file_index_t> *local_50;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  uint local_38;
  undefined1 local_34;
  undefined1 local_33;
  
  pfVar5 = torrent_info::orig_files
                     ((this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  peVar6 = (element_type *)
           torrent_info::orig_files
                     ((this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  peVar2 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68 = (element_type *)0x0;
  if (peVar6 != peVar2) {
    local_68 = peVar2;
  }
  uVar1 = *(uint *)&this->field_0x5c0;
  info_hash_t::get_best(&local_b0,&this->m_info_hash);
  bVar3 = torrent_info::v1((this->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  local_33 = torrent_info::v2((this->super_torrent_hot_members).m_torrent_file.
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  local_48 = local_b0.m_number._M_elems[0];
  uStack_44 = local_b0.m_number._M_elems[1];
  uStack_40 = local_b0.m_number._M_elems[2];
  uStack_3c = local_b0.m_number._M_elems[3];
  local_38 = local_b0.m_number._M_elems[4];
  local_70 = pfVar5;
  local_60 = &this->m_save_path;
  local_58 = uVar1 >> 4 & 3;
  local_50 = &this->m_file_priority;
  local_34 = bVar3;
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [4])();
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_98,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
  local_88 = local_98;
  a_Stack_80[0]._M_pi = _Stack_90._M_pi;
  local_98 = 0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar4))
            (&local_b0,(undefined8 *)CONCAT44(extraout_var,iVar4),&local_70,&local_88);
  storage_holder::operator=(&this->m_storage,(storage_holder *)&local_b0);
  storage_holder::~storage_holder((storage_holder *)&local_b0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_80);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  return;
}

Assistant:

void torrent::construct_storage()
	{
		storage_params params{
			m_torrent_file->orig_files(),
			&m_torrent_file->orig_files() != &m_torrent_file->files()
				? &m_torrent_file->files() : nullptr,
			m_save_path,
			static_cast<storage_mode_t>(m_storage_mode),
			m_file_priority,
			m_info_hash.get_best(),
			m_torrent_file->v1(),
			m_torrent_file->v2()
		};

		// the shared_from_this() will create an intentional
		// cycle of ownership, se the hpp file for description.
		m_storage = m_ses.disk_thread().new_torrent(params, shared_from_this());
	}